

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O3

void __thiscall
slang::ast::builtins::SignedConversionFunction::SignedConversionFunction
          (SignedConversionFunction *this,KnownSystemName knownNameId,bool toSigned)

{
  string_view sVar1;
  
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005da020;
  sVar1 = parsing::toString(knownNameId);
  (this->super_SystemSubroutine).name._M_dataplus._M_p =
       (pointer)&(this->super_SystemSubroutine).name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_SystemSubroutine).name,sVar1._M_str,sVar1._M_str + sVar1._M_len
            );
  (this->super_SystemSubroutine).kind = Function;
  (this->super_SystemSubroutine).knownNameId = knownNameId;
  (this->super_SystemSubroutine).hasOutputArgs = false;
  (this->super_SystemSubroutine).neverReturns = false;
  (this->super_SystemSubroutine).withClauseMode = None;
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005d5150;
  this->toSigned = toSigned;
  return;
}

Assistant:

SignedConversionFunction(KnownSystemName knownNameId, bool toSigned) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), toSigned(toSigned) {}